

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O0

void __thiscall
BMRS_XZ<RemSP>::InitCompressedDataMem
          (BMRS_XZ<RemSP> *this,Data_Compressed *data_compressed,MemMat<unsigned_char> *img)

{
  int iVar1;
  int iVar2;
  int c;
  uchar *puVar3;
  int local_60;
  int j_1;
  int jbase;
  uint64_t obits_final;
  uint64_t obits;
  int j_base;
  int j;
  uchar *source;
  uint64_t *mbits;
  int i;
  int h;
  int w;
  MemMat<unsigned_char> *img_local;
  Data_Compressed *data_compressed_local;
  BMRS_XZ<RemSP> *this_local;
  
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  iVar2 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  for (mbits._4_4_ = 0; mbits._4_4_ < iVar2; mbits._4_4_ = mbits._4_4_ + 1) {
    source = (uchar *)Data_Compressed::operator[](data_compressed,(long)mbits._4_4_);
    cv::Mat::ptr<unsigned_char>
              (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,mbits._4_4_);
    for (obits._4_4_ = 0; obits._4_4_ < iVar1 >> 6; obits._4_4_ = obits._4_4_ + 1) {
      c = obits._4_4_ * 0x40;
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c);
      obits_final = (uint64_t)(*puVar3 != '\0');
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 1);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 2;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 2);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 4;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 3);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 8;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 4);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x10;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 5);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x20;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 6);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x40;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 7);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x80;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 8);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x100;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 9);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x200;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 10);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x400;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0xb);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x800;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0xc);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x1000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0xd);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x2000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0xe);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x4000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0xf);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x8000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x10);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x10000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x11);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x20000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x12);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x40000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x13);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x80000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x14);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x100000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x15);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x200000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x16);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x400000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x17);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x800000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x18);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x1000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x19);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x2000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x1a);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x4000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x1b);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x8000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x1c);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x10000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x1d);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x20000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x1e);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x40000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x1f);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x80000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x20);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x100000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x21);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x200000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x22);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x400000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x23);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x800000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x24);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x1000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x25);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x2000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x26);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x4000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x27);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x8000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x28);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x10000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x29);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x20000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x2a);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x40000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x2b);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x80000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x2c);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x100000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x2d);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x200000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x2e);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x400000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x2f);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x800000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x30);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x1000000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x31);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x2000000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x32);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x4000000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x33);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x8000000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x34);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x10000000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x35);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x20000000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x36);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x40000000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x37);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x80000000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x38);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x100000000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x39);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x200000000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x3a);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x400000000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x3b);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x800000000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x3c);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x1000000000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x3d);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x2000000000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x3e);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x4000000000000000;
      }
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,c + 0x3f);
      if (*puVar3 != '\0') {
        obits_final = obits_final | 0x8000000000000000;
      }
      *(uint64_t *)source = obits_final;
      source = source + 8;
    }
    _j_1 = 0;
    for (local_60 = 0; local_60 < iVar1 % 0x40; local_60 = local_60 + 1) {
      puVar3 = MemMat<unsigned_char>::operator()(img,mbits._4_4_,(iVar1 - iVar1 % 0x40) + local_60);
      if (*puVar3 != '\0') {
        _j_1 = 1L << ((byte)local_60 & 0x3f) | _j_1;
      }
    }
    *(ulong *)source = _j_1;
  }
  return;
}

Assistant:

void InitCompressedDataMem(Data_Compressed& data_compressed, MemMat<unsigned char>& img) {
        int w(img_.cols);
        int h(img_.rows);

        for (int i = 0; i < h; i++) {
            uint64_t* mbits = data_compressed[i];
            uchar* source = img_.ptr<uchar>(i);
            for (int j = 0; j < w >> 6; j++) {
                int j_base = (j << 6);
                uint64_t obits = 0;
                if (img(i, j_base + 0)) obits |= 0x0000000000000001;
                if (img(i, j_base + 1)) obits |= 0x0000000000000002;
                if (img(i, j_base + 2)) obits |= 0x0000000000000004;
                if (img(i, j_base + 3)) obits |= 0x0000000000000008;
                if (img(i, j_base + 4)) obits |= 0x0000000000000010;
                if (img(i, j_base + 5)) obits |= 0x0000000000000020;
                if (img(i, j_base + 6)) obits |= 0x0000000000000040;
                if (img(i, j_base + 7)) obits |= 0x0000000000000080;
                if (img(i, j_base + 8)) obits |= 0x0000000000000100;
                if (img(i, j_base + 9)) obits |= 0x0000000000000200;
                if (img(i, j_base + 10)) obits |= 0x0000000000000400;
                if (img(i, j_base + 11)) obits |= 0x0000000000000800;
                if (img(i, j_base + 12)) obits |= 0x0000000000001000;
                if (img(i, j_base + 13)) obits |= 0x0000000000002000;
                if (img(i, j_base + 14)) obits |= 0x0000000000004000;
                if (img(i, j_base + 15)) obits |= 0x0000000000008000;
                if (img(i, j_base + 16)) obits |= 0x0000000000010000;
                if (img(i, j_base + 17)) obits |= 0x0000000000020000;
                if (img(i, j_base + 18)) obits |= 0x0000000000040000;
                if (img(i, j_base + 19)) obits |= 0x0000000000080000;
                if (img(i, j_base + 20)) obits |= 0x0000000000100000;
                if (img(i, j_base + 21)) obits |= 0x0000000000200000;
                if (img(i, j_base + 22)) obits |= 0x0000000000400000;
                if (img(i, j_base + 23)) obits |= 0x0000000000800000;
                if (img(i, j_base + 24)) obits |= 0x0000000001000000;
                if (img(i, j_base + 25)) obits |= 0x0000000002000000;
                if (img(i, j_base + 26)) obits |= 0x0000000004000000;
                if (img(i, j_base + 27)) obits |= 0x0000000008000000;
                if (img(i, j_base + 28)) obits |= 0x0000000010000000;
                if (img(i, j_base + 29)) obits |= 0x0000000020000000;
                if (img(i, j_base + 30)) obits |= 0x0000000040000000;
                if (img(i, j_base + 31)) obits |= 0x0000000080000000;
                if (img(i, j_base + 32)) obits |= 0x0000000100000000;
                if (img(i, j_base + 33)) obits |= 0x0000000200000000;
                if (img(i, j_base + 34)) obits |= 0x0000000400000000;
                if (img(i, j_base + 35)) obits |= 0x0000000800000000;
                if (img(i, j_base + 36)) obits |= 0x0000001000000000;
                if (img(i, j_base + 37)) obits |= 0x0000002000000000;
                if (img(i, j_base + 38)) obits |= 0x0000004000000000;
                if (img(i, j_base + 39)) obits |= 0x0000008000000000;
                if (img(i, j_base + 40)) obits |= 0x0000010000000000;
                if (img(i, j_base + 41)) obits |= 0x0000020000000000;
                if (img(i, j_base + 42)) obits |= 0x0000040000000000;
                if (img(i, j_base + 43)) obits |= 0x0000080000000000;
                if (img(i, j_base + 44)) obits |= 0x0000100000000000;
                if (img(i, j_base + 45)) obits |= 0x0000200000000000;
                if (img(i, j_base + 46)) obits |= 0x0000400000000000;
                if (img(i, j_base + 47)) obits |= 0x0000800000000000;
                if (img(i, j_base + 48)) obits |= 0x0001000000000000;
                if (img(i, j_base + 49)) obits |= 0x0002000000000000;
                if (img(i, j_base + 50)) obits |= 0x0004000000000000;
                if (img(i, j_base + 51)) obits |= 0x0008000000000000;
                if (img(i, j_base + 52)) obits |= 0x0010000000000000;
                if (img(i, j_base + 53)) obits |= 0x0020000000000000;
                if (img(i, j_base + 54)) obits |= 0x0040000000000000;
                if (img(i, j_base + 55)) obits |= 0x0080000000000000;
                if (img(i, j_base + 56)) obits |= 0x0100000000000000;
                if (img(i, j_base + 57)) obits |= 0x0200000000000000;
                if (img(i, j_base + 58)) obits |= 0x0400000000000000;
                if (img(i, j_base + 59)) obits |= 0x0800000000000000;
                if (img(i, j_base + 60)) obits |= 0x1000000000000000;
                if (img(i, j_base + 61)) obits |= 0x2000000000000000;
                if (img(i, j_base + 62)) obits |= 0x4000000000000000;
                if (img(i, j_base + 63)) obits |= 0x8000000000000000;
                *mbits = obits, mbits++;
            }
            uint64_t obits_final = 0;
            int jbase = w - (w % 64);
            for (int j = 0; j < w % 64; j++) {
                if (img(i, jbase + j)) obits_final |= ((uint64_t)1 << j);
            }
            *mbits = obits_final;
        }
    }